

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void P_ReadDemoWeaponsChunk(BYTE **demo)

{
  uint amount;
  Node *pNVar1;
  char *name;
  PClass *p;
  PClassWeapon *key;
  long lVar2;
  
  amount = ReadWord(demo);
  TArray<PClassWeapon_*,_PClassWeapon_*>::Resize(&Weapons_ntoh,amount);
  TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::Clear
            (&Weapons_hton,amount);
  *Weapons_ntoh.Array = (PClassWeapon *)0x0;
  pNVar1 = TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::GetNode
                     (&Weapons_hton,(PClassWeapon *)0x0);
  (pNVar1->Pair).Value = 0;
  for (lVar2 = 1; lVar2 < (int)amount; lVar2 = lVar2 + 1) {
    name = ReadStringConst(demo);
    p = PClass::FindClass(name);
    key = dyn_cast<PClassWeapon>((DObject *)p);
    Weapons_ntoh.Array[lVar2] = key;
    if (key != (PClassWeapon *)0x0) {
      pNVar1 = TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::GetNode
                         (&Weapons_hton,key);
      (pNVar1->Pair).Value = (int)lVar2;
    }
  }
  return;
}

Assistant:

void P_ReadDemoWeaponsChunk(BYTE **demo)
{
	int count, i;
	PClassWeapon *type;
	const char *s;

	count = ReadWord(demo);
	Weapons_ntoh.Resize(count);
	Weapons_hton.Clear(count);

	Weapons_ntoh[0] = type = NULL;
	Weapons_hton[type] = 0;

	for (i = 1; i < count; ++i)
	{
		s = ReadStringConst(demo);
		type = dyn_cast<PClassWeapon>(PClass::FindClass(s));
		// If a demo was recorded with a weapon that is no longer present,
		// should we report it?
		Weapons_ntoh[i] = type;
		if (type != NULL)
		{
			Weapons_hton[type] = i;
		}
	}
}